

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O0

void __thiscall QCache<QString,_QConfFile>::Node::Node(Node *this,Node *other)

{
  QString *in_RSI;
  QString *in_RDI;
  
  (in_RDI->d).d = (in_RSI->d).d;
  (in_RDI->d).ptr = (in_RSI->d).ptr;
  QString::QString(in_RSI,in_RDI);
  Value::Value((Value *)&in_RDI[1].d.size,(Value *)&in_RSI[1].d.size);
  (((in_RDI->d).d)->super_QArrayData).alloc = (qsizetype)in_RDI;
  *(QString **)(in_RDI->d).ptr = in_RDI;
  return;
}

Assistant:

Node(Node &&other)
            : Chain(other),
              key(std::move(other.key)),
              value(std::move(other.value))
        {
            Q_ASSERT(this->prev);
            Q_ASSERT(this->next);
            this->prev->next = this;
            this->next->prev = this;
        }